

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O1

set<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>,_std::less<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>
* __thiscall
GLRParser::parseString
          (set<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>,_std::less<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>
           *__return_storage_ptr__,GLRParser *this,string *toParse)

{
  char cVar1;
  int *piVar2;
  pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
  *ppVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  GLRState *pGVar7;
  _Rb_tree_node_base *p_Var8;
  ostream *poVar9;
  ulong uVar10;
  GLRParser *pGVar11;
  undefined1 auVar12 [8];
  _Elt_pointer pbVar13;
  GLRState *pGVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  bool bVar19;
  vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
  possibleParseStacks;
  set<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>,_std::less<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>
  *finals;
  set<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>,_std::less<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>_>
  alreadyReducedStacks;
  string succes;
  vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
  newPossibleParseStacks;
  pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
  newStack;
  set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
  parseOperations;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  startStack;
  undefined1 local_248 [8];
  pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
  *ppStack_240;
  pointer local_238;
  _Base_ptr local_228;
  uint local_21c;
  string *local_218;
  GLRState *local_210;
  size_type local_208;
  char *local_200;
  undefined1 local_1f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  GLRState *local_1d8;
  size_t local_1d0;
  char *local_1c8;
  _Base_ptr local_1c0;
  undefined1 local_1b8 [16];
  vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
  local_1a8;
  char *local_188;
  pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
  *local_180;
  undefined1 local_178 [16];
  _Base_ptr local_168 [4];
  GLRState *local_148;
  GLRState *local_140;
  GLRState *local_130;
  _Deque_base<Production_*,_std::allocator<Production_*>_> local_128;
  undefined1 local_d8 [16];
  _Base_ptr local_c8;
  _Rb_tree_node_base *p_Stack_c0;
  _Base_ptr local_b8;
  _Map_pointer pppPStack_b0;
  _Elt_pointer local_a8;
  _Elt_pointer ppPStack_a0;
  _Elt_pointer local_98;
  _Map_pointer pppPStack_90;
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  
  local_248 = (undefined1  [8])0x0;
  ppStack_240 = (pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
                 *)0x0;
  local_238 = (pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_228 = (_Base_ptr)__return_storage_ptr__;
  local_218 = toParse;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map(&local_88,0);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_88,&this->startState->name);
  local_98 = (_Elt_pointer)0x0;
  pppPStack_90 = (_Map_pointer)0x0;
  local_a8 = (_Elt_pointer)0x0;
  ppPStack_a0 = (_Elt_pointer)0x0;
  local_b8 = (_Base_ptr)0x0;
  pppPStack_b0 = (_Map_pointer)0x0;
  local_c8 = (_Base_ptr)0x0;
  p_Stack_c0 = (_Rb_tree_node_base *)0x0;
  local_d8._0_8_ = (_Base_ptr)0x0;
  local_d8._8_8_ = (_Base_ptr)0x0;
  std::_Deque_base<Production_*,_std::allocator<Production_*>_>::_M_initialize_map
            ((_Deque_base<Production_*,_std::allocator<Production_*>_> *)local_d8,0);
  std::
  pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
  ::
  pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_true>
            ((pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
              *)local_178,
             (stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_88,
             (stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_> *)
             local_d8);
  std::
  vector<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>,std::allocator<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>>>
  ::
  emplace_back<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>>
            ((vector<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>,std::allocator<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>>>
              *)local_248,
             (pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
              *)local_178);
  std::_Deque_base<Production_*,_std::allocator<Production_*>_>::~_Deque_base(&local_128);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_178);
  std::_Deque_base<Production_*,_std::allocator<Production_*>_>::~_Deque_base
            ((_Deque_base<Production_*,_std::allocator<Production_*>_> *)local_d8);
  local_1c8 = local_1b8;
  local_1c0 = (_Base_ptr)0x0;
  local_1b8[0] = _S_red;
  local_200 = (char *)local_218->_M_string_length;
  if (local_200 != (char *)0x0) {
    pcVar6 = (local_218->_M_dataplus)._M_p;
    local_200 = pcVar6 + (long)local_200;
    local_208 = 0;
    local_21c = 0;
    local_210 = (GLRState *)this;
    do {
      cVar1 = *pcVar6;
      local_208 = local_208 + 1;
      local_1a8.
      super__Vector_base<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1a8.
      super__Vector_base<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1a8.
      super__Vector_base<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_180 = ppStack_240;
      auVar12 = local_248;
      local_188 = pcVar6;
      if (local_248 != (undefined1  [8])ppStack_240) {
        do {
          pbVar13 = (((pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
                       *)auVar12)->first).c.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (pbVar13 ==
              (((pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
                 *)auVar12)->first).c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            pbVar13 = (((pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
                         *)auVar12)->first).c.
                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
          }
          iVar5 = std::__cxx11::string::compare((char *)(pbVar13 + -1));
          pGVar14 = local_210;
          if ((iVar5 == 0) && (local_218->_M_string_length == local_208)) break;
          pbVar13 = (((pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
                       *)auVar12)->first).c.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (pbVar13 ==
              (((pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
                 *)auVar12)->first).c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            pbVar13 = (((pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
                         *)auVar12)->first).c.
                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
          }
          pGVar7 = findState((GLRParser *)local_210,pbVar13 + -1);
          toString_abi_cxx11_((string *)local_178,cVar1);
          findParseOptions((set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
                            *)local_d8,(GLRParser *)pGVar14,(string *)local_178,pGVar7);
          p_Var8 = p_Stack_c0;
          if ((GLRParser *)local_178._0_8_ != (GLRParser *)local_168) {
            operator_delete((void *)local_178._0_8_,
                            (ulong)((long)&((_Alloc_hider *)&local_168[0]->_M_color)->_M_p + 1));
            p_Var8 = p_Stack_c0;
          }
          for (; p_Var8 != (_Rb_tree_node_base *)(local_d8 + 8);
              p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
            piVar2 = *(int **)(p_Var8 + 1);
            std::
            pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
            ::pair((pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
                    *)local_178,
                   (pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
                    *)auVar12);
            if (*piVar2 == 1) {
              toString_abi_cxx11_((string *)local_1f8,cVar1);
              std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         local_178,(string *)local_1f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._0_8_ != &local_1e8) {
                operator_delete((void *)local_1f8._0_8_,local_1e8._M_allocated_capacity + 1);
              }
              std::
              deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_178,*(value_type **)(piVar2 + 4));
              std::
              vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
              ::push_back(&local_1a8,(value_type *)local_178);
            }
            std::_Deque_base<Production_*,_std::allocator<Production_*>_>::~_Deque_base(&local_128);
            std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_178);
          }
          std::
          _Rb_tree<ParseOperation_*,_ParseOperation_*,_std::_Identity<ParseOperation_*>,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
          ::~_Rb_tree((_Rb_tree<ParseOperation_*,_ParseOperation_*,_std::_Identity<ParseOperation_*>,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
                       *)local_d8);
          auVar12 = (undefined1  [8])((long)auVar12 + 0xa0);
        } while (auVar12 != (undefined1  [8])local_180);
      }
      pGVar11 = (GLRParser *)local_248;
      std::
      vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
      ::operator=((vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
                   *)pGVar11,&local_1a8);
      pGVar14 = local_210;
      if (local_248 != (undefined1  [8])ppStack_240) {
        pGVar11 = (GLRParser *)&local_1c8;
        std::__cxx11::string::push_back((char)pGVar11);
      }
      removeDuplicates(pGVar11,(vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
                                *)local_248);
      if (*(bool *)&(pGVar14->name)._M_dataplus._M_p == true) {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
        std::ostream::put('\x18');
        poVar9 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Output after processing ",0x18);
        toString_abi_cxx11_((string *)local_178,cVar1);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(char *)local_178._0_8_,local_178._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        pGVar11 = (GLRParser *)local_178._0_8_;
        if ((GLRParser *)local_178._0_8_ != (GLRParser *)local_168) {
          operator_delete((void *)local_178._0_8_,
                          (ulong)((long)&((_Alloc_hider *)&local_168[0]->_M_color)->_M_p + 1));
        }
        printStackSet(pGVar11,(vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
                               *)local_248);
      }
      local_1f8._8_4_ = _S_red;
      local_1e8._M_allocated_capacity = 0;
      local_1e8._8_8_ = local_1f8 + 8;
      local_1d0 = 0;
      local_1d8 = (GLRState *)local_1e8._8_8_;
      if ((undefined1  [8])ppStack_240 != local_248) {
        lVar17 = 0;
        uVar18 = 0;
        do {
          std::
          pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
          ::pair((pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
                  *)local_178,
                 (pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
                  *)((long)&(((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_248)->c).
                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_map + lVar17));
          pGVar14 = local_210;
          pGVar7 = local_148;
          if (local_148 == local_140) {
            pGVar7 = (GLRState *)
                     (local_130[-1].statesTo._M_t._M_impl.super__Rb_tree_header._M_node_count +
                     0x200);
          }
          pGVar7 = findState((GLRParser *)local_210,
                             (string *)
                             &pGVar7[-1].statesTo._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_parent);
          std::deque<Production_*,_std::allocator<Production_*>_>::deque
                    ((deque<Production_*,_std::allocator<Production_*>_> *)local_d8,
                     (deque<Production_*,_std::allocator<Production_*>_> *)&local_128);
          uVar15 = local_21c & 0xff;
          uVar16 = local_21c & 0xff;
          bVar4 = checkProductionRules
                            ((GLRParser *)pGVar14,
                             (vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
                              *)local_248,
                             (stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_178,
                             (stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>
                              *)local_d8,pGVar7,
                             (set<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>,_std::less<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>_>
                              *)local_1f8,(bool)((byte)local_21c & 1));
          bVar19 = local_218->_M_string_length != local_208;
          if (!bVar19) {
            uVar16 = 1;
          }
          local_21c = uVar16;
          cVar1 = bVar19 * '\x02' + '\b';
          if (!bVar4) {
            local_21c = uVar15;
            cVar1 = '\0';
          }
          std::_Deque_base<Production_*,_std::allocator<Production_*>_>::~_Deque_base
                    ((_Deque_base<Production_*,_std::allocator<Production_*>_> *)local_d8);
          std::_Deque_base<Production_*,_std::allocator<Production_*>_>::~_Deque_base(&local_128);
          pGVar11 = (GLRParser *)local_178;
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_178);
          if ((cVar1 != '\0') && (cVar1 != '\n')) break;
          uVar18 = uVar18 + 1;
          uVar10 = ((long)ppStack_240 - (long)local_248 >> 5) * -0x3333333333333333;
          lVar17 = lVar17 + 0xa0;
        } while (uVar18 <= uVar10 && uVar10 - uVar18 != 0);
      }
      removeDuplicates(pGVar11,(vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
                                *)local_248);
      if (*(bool *)&(local_210->name)._M_dataplus._M_p == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Output after reducing and eleminating doubles: ",0x2f);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
        pGVar11 = (GLRParser *)std::ostream::put('\x18');
        std::ostream::flush();
        printStackSet(pGVar11,(vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
                               *)local_248);
      }
      std::
      _Rb_tree<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>,_std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>,_std::_Identity<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>,_std::less<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>_>
      ::~_Rb_tree((_Rb_tree<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>,_std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>,_std::_Identity<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>,_std::less<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>_>
                   *)local_1f8);
      std::
      vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
      ::~vector(&local_1a8);
      pcVar6 = local_188 + 1;
    } while (pcVar6 != local_200);
  }
  ppVar3 = ppStack_240;
  (((_Rb_tree_header *)&local_228->_M_parent)->_M_header)._M_color = _S_red;
  local_228->_M_left = (_Base_ptr)0x0;
  local_228->_M_right = (_Base_ptr)&local_228->_M_parent;
  *(_Rb_tree_header **)(local_228 + 1) = (_Rb_tree_header *)&local_228->_M_parent;
  local_228[1]._M_parent = (_Base_ptr)0x0;
  if (local_248 != (undefined1  [8])ppStack_240) {
    auVar12 = local_248;
    do {
      std::
      pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
      ::pair((pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
              *)local_178,
             (pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
              *)auVar12);
      pGVar14 = local_148;
      if (local_148 == local_140) {
        pGVar14 = (GLRState *)
                  (local_130[-1].statesTo._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x200);
      }
      iVar5 = std::__cxx11::string::compare
                        ((char *)&pGVar14[-1].statesTo._M_t._M_impl.super__Rb_tree_header._M_header.
                                  _M_parent);
      if (iVar5 == 0) {
        std::
        _Rb_tree<std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>,std::_Identity<std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>,std::less<std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>,std::allocator<std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>>
        ::
        _M_insert_unique<std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>const&>
                  ((_Rb_tree<std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>,std::_Identity<std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>,std::less<std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>,std::allocator<std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>>
                    *)local_228,
                   (stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_> *)
                   &local_128);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"String accepted.",0x10);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
        std::ostream::put('\x18');
        std::ostream::flush();
      }
      std::_Deque_base<Production_*,_std::allocator<Production_*>_>::~_Deque_base(&local_128);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_178);
      auVar12 = (undefined1  [8])((long)auVar12 + 0xa0);
    } while (auVar12 != (undefined1  [8])ppVar3);
  }
  if (local_228[1]._M_parent == (_Base_ptr)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Something went wrong, probably after this text: ",0x30);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
    std::ostream::put('\x18');
    std::ostream::flush();
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_1c8,(long)local_1c0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,CONCAT71(local_1b8._1_7_,local_1b8[0]) + 1);
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_88);
  std::
  vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
  ::~vector((vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
             *)local_248);
  return (set<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>,_std::less<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>
          *)local_228;
}

Assistant:

set<stack<Production *>> GLRParser::parseString(const std::string &toParse) {

    std::vector<std::pair<std::stack<std::string>, std::stack<Production *>>> possibleParseStacks; // Must be a vector to be able to append at the end

    std::stack<std::string> startStack;
    startStack.push(startState->getName());
    possibleParseStacks.push_back(std::pair<std::stack<std::string>, std::stack<Production *>>(startStack, {}));

    bool finalStack = false;

    std::string succes;

    int position = 0;
    for (auto c: toParse) {
        position++;

//        if (c == ' ' or c == '\n') { continue; }

        std::vector<std::pair<std::stack<std::string>, std::stack<Production *>>> newPossibleParseStacks;
        for (auto &stack : possibleParseStacks) {
            // Can't use auto iterator, because we're inserting elements during the loop

            if (stack.first.top() == "accept" and position == toParse.size()) { break; }
            GLRState *currentState = findState(stack.first.top());

            //            std::pair<std::string, GLRState *> searchKey{toString(c), currentState};
//            std::set<ParseOperation *> parseOperations = parseTable[searchKey];

            set<ParseOperation *> parseOperations = findParseOptions(toString(c), currentState);

            for (auto parseOperation: parseOperations) {

                std::pair<std::stack<std::string>, std::stack<Production *>> newStack = stack;

                if (parseOperation->getOperationType() == ParseOperation::shift) {

                    newStack.first.push(toString(c));
                    newStack.first.push(parseOperation->getNewState()->getName());
                    newPossibleParseStacks.push_back(newStack);

                } else {
                    continue; // Don't push the stack back
                }

            }
        }
        possibleParseStacks = newPossibleParseStacks;

        if (!possibleParseStacks.empty()) {
            succes += c;
        }

        removeDuplicates(possibleParseStacks);
        if (verbose) {
            std::cout << std::endl << "Output after processing " << toString(c) << std::endl;
            printStackSet(possibleParseStacks);
        }

        std::set<std::pair<std::stack<std::string>, Production *>> alreadyReducedStacks; // S -> a, S->ab, after input a, you only want one of the stacks to be reduced
        // Check the production rules in the new added stacks
        for (int i = 0; i < possibleParseStacks.size(); ++i) {
            const std::pair<std::stack<std::string>, std::stack<Production *>> stack = possibleParseStacks[i];
            GLRState *currentState = findState(stack.first.top());
            std::stack<Production *> productions = stack.second;
            if (checkProductionRules(possibleParseStacks, stack.first, productions, currentState,
                                     alreadyReducedStacks, finalStack)) {
                if (position == toParse.size()) {
                    finalStack = true;
                    break;
                } else {
                    continue;
                }
            }
        }

        removeDuplicates(possibleParseStacks);

        if (verbose) {
            std::cout << "Output after reducing and eleminating doubles: " << std::endl;
            printStackSet(possibleParseStacks);
        }
    }

//    bool final = false;
    std::set<std::stack<Production *>> finals;
    for (auto stack: possibleParseStacks) {
        // TODO: Check: is it always the case when top == 1, the string is accepted?
        if (stack.first.top() == "accept") {
//                final = true;
            finals.insert(
                    stack.second); // TODO: Check whether it still returns and the object doesn't get destroyed when leaving the function
            std::cout << "String accepted." << std::endl;
        }
    }

    if (finals.empty()) {
        std::cout << "Something went wrong, probably after this text: " << std::endl;
        std::cout << succes << std::endl;
    }

    return finals;
}